

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

void xmlDebugDumpEntities(FILE *output,xmlDocPtr doc)

{
  xmlHashTablePtr pxVar1;
  xmlEntitiesTablePtr table_1;
  xmlEntitiesTablePtr table;
  xmlDebugCtxt ctxt;
  
  if (output != (FILE *)0x0) {
    xmlCtxtDumpInitCtxt(&ctxt);
    if (doc != (xmlDocPtr)0x0) {
      ctxt.output = output;
      xmlCtxtDumpDocHead(&ctxt,doc);
      if ((doc->intSubset == (_xmlDtd *)0x0) ||
         (pxVar1 = (xmlHashTablePtr)doc->intSubset->entities, pxVar1 == (xmlHashTablePtr)0x0)) {
        fwrite("No entities in internal subset\n",0x1f,1,(FILE *)ctxt.output);
      }
      else {
        if (ctxt.check == 0) {
          fwrite("Entities in internal subset\n",0x1c,1,(FILE *)ctxt.output);
        }
        xmlHashScan(pxVar1,xmlCtxtDumpEntityCallback,&ctxt);
      }
      if ((doc->extSubset == (_xmlDtd *)0x0) ||
         (pxVar1 = (xmlHashTablePtr)doc->extSubset->entities, pxVar1 == (xmlHashTablePtr)0x0)) {
        if (ctxt.check == 0) {
          fwrite("No entities in external subset\n",0x1f,1,(FILE *)ctxt.output);
        }
      }
      else {
        if (ctxt.check == 0) {
          fwrite("Entities in external subset\n",0x1c,1,(FILE *)ctxt.output);
        }
        xmlHashScan(pxVar1,xmlCtxtDumpEntityCallback,&ctxt);
      }
    }
  }
  return;
}

Assistant:

void
xmlDebugDumpEntities(FILE * output, xmlDocPtr doc)
{
    xmlDebugCtxt ctxt;

    if (output == NULL) return;
    xmlCtxtDumpInitCtxt(&ctxt);
    ctxt.output = output;
    xmlCtxtDumpEntities(&ctxt, doc);
    xmlCtxtDumpCleanCtxt(&ctxt);
}